

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Vector2f __thiscall Rml::Element::GetContainingBlock(Element *this)

{
  float fVar1;
  Vector2i local_50 [2];
  Context *local_40;
  Context *context;
  Vector2f local_30;
  Box *local_28;
  Box *parent_box;
  Element *pEStack_18;
  Position position_property;
  Element *this_local;
  Vector2f containing_block;
  
  pEStack_18 = this;
  Vector2<float>::Vector2((Vector2<float> *)&this_local);
  if (this->offset_parent == (Element *)0x0) {
    local_40 = GetContext(this);
    if (local_40 != (Context *)0x0) {
      local_50[0] = Context::GetDimensions(local_40);
      this_local = (Element *)Vector2::operator_cast_to_Vector2((Vector2 *)local_50);
    }
  }
  else {
    parent_box._7_1_ = GetPosition(this);
    local_28 = GetBox(this->offset_parent);
    if ((parent_box._7_1_ == Static) || (parent_box._7_1_ == Relative)) {
      local_30 = Box::GetSize(local_28);
      this_local = (Element *)local_30;
      fVar1 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
      this_local = (Element *)CONCAT44(this_local._4_4_,this_local._0_4_ - fVar1);
      fVar1 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
      this_local = (Element *)CONCAT44(this_local._4_4_ - fVar1,this_local._0_4_);
    }
    else if ((parent_box._7_1_ == Absolute) || (parent_box._7_1_ == Fixed)) {
      this_local = (Element *)Box::GetSize(local_28,Padding);
    }
  }
  return (Vector2f)this_local;
}

Assistant:

Vector2f Element::GetContainingBlock()
{
	Vector2f containing_block;

	if (offset_parent)
	{
		using namespace Style;
		Position position_property = GetPosition();
		const Box& parent_box = offset_parent->GetBox();

		if (position_property == Position::Static || position_property == Position::Relative)
		{
			containing_block = parent_box.GetSize();
			containing_block.x -= meta->scroll.GetScrollbarSize(ElementScroll::VERTICAL);
			containing_block.y -= meta->scroll.GetScrollbarSize(ElementScroll::HORIZONTAL);
		}
		else if (position_property == Position::Absolute || position_property == Position::Fixed)
		{
			containing_block = parent_box.GetSize(BoxArea::Padding);
		}
	}
	else if (Context* context = GetContext())
	{
		containing_block = Vector2f(context->GetDimensions());
	}

	return containing_block;
}